

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Array<unsigned_char> * __thiscall
kj::anon_unknown_36::WebSocketImpl::serializeClose
          (Array<unsigned_char> *__return_storage_ptr__,WebSocketImpl *this,uint16_t code,
          StringPtr reason)

{
  bool bVar1;
  size_t sVar2;
  uchar *puVar3;
  char *__src;
  Array<unsigned_char> *other;
  Array<unsigned_char> local_b0;
  Fault local_98;
  Fault f;
  size_t local_80;
  DebugExpression<unsigned_long> local_78;
  undefined1 local_70 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  Array<unsigned_char> payload;
  uint16_t code_local;
  WebSocketImpl *this_local;
  StringPtr reason_local;
  
  reason_local.content.ptr = (char *)reason.content.size_;
  this_local = (WebSocketImpl *)reason.content.ptr;
  reason_local.content.size_ = (size_t)__return_storage_ptr__;
  Array<unsigned_char>::Array((Array<unsigned_char> *)&_kjCondition.result);
  if (code == 0x3ed) {
    local_80 = StringPtr::size((StringPtr *)&this_local);
    local_78 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_80);
    f.exception._0_4_ = 0;
    kj::_::DebugExpression<unsigned_long>::operator==
              ((DebugComparison<unsigned_long,_int> *)local_70,&local_78,(int *)&f);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_70);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[47]>
                (&local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0xe14,FAILED,"reason.size() == 0",
                 "_kjCondition,\"WebSocket close code 1005 cannot have a reason\"",
                 (DebugComparison<unsigned_long,_int> *)local_70,
                 (char (*) [47])"WebSocket close code 1005 cannot have a reason");
      kj::_::Debug::Fault::fatal(&local_98);
    }
  }
  else {
    sVar2 = StringPtr::size((StringPtr *)&this_local);
    heapArray<unsigned_char>(&local_b0,sVar2 + 2);
    Array<unsigned_char>::operator=((Array<unsigned_char> *)&_kjCondition.result,&local_b0);
    Array<unsigned_char>::~Array(&local_b0);
    payload.disposer._7_1_ = (uchar)(code >> 8);
    puVar3 = Array<unsigned_char>::operator[]((Array<unsigned_char> *)&_kjCondition.result,0);
    *puVar3 = payload.disposer._7_1_;
    payload.disposer._6_1_ = (uchar)code;
    puVar3 = Array<unsigned_char>::operator[]((Array<unsigned_char> *)&_kjCondition.result,1);
    *puVar3 = payload.disposer._6_1_;
    puVar3 = Array<unsigned_char>::begin((Array<unsigned_char> *)&_kjCondition.result);
    __src = StringPtr::begin((StringPtr *)&this_local);
    sVar2 = StringPtr::size((StringPtr *)&this_local);
    memcpy(puVar3 + 2,__src,sVar2);
  }
  other = mv<kj::Array<unsigned_char>>((Array<unsigned_char> *)&_kjCondition.result);
  Array<unsigned_char>::Array(__return_storage_ptr__,other);
  Array<unsigned_char>::~Array((Array<unsigned_char> *)&_kjCondition.result);
  return __return_storage_ptr__;
}

Assistant:

kj::Array<byte> serializeClose(uint16_t code, kj::StringPtr reason) {
    kj::Array<byte> payload;
    if (code == 1005) {
      KJ_REQUIRE(reason.size() == 0, "WebSocket close code 1005 cannot have a reason");

      // code 1005 -- leave payload empty
    } else {
      payload = heapArray<byte>(reason.size() + 2);
      payload[0] = code >> 8;
      payload[1] = code;
      memcpy(payload.begin() + 2, reason.begin(), reason.size());
    }
    return kj::mv(payload);
  }